

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O0

void __thiscall hrvo::Agent::Agent(Agent *this,Simulator *simulator,Vector2 *position,size_t goalNo)

{
  undefined8 in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = *(undefined8 *)(*(long *)*in_RDI + 0x20);
  in_RDI[2] = *in_RDX;
  Vector2::Vector2((Vector2 *)(in_RDI + 3));
  in_RDI[4] = *(undefined8 *)(*(long *)*in_RDI + 0x20);
  in_RDI[5] = in_RCX;
  in_RDI[6] = *(undefined8 *)(*(long *)*in_RDI + 0x30);
  *(undefined4 *)(in_RDI + 7) = *(undefined4 *)(*(long *)*in_RDI + 0x38);
  *(undefined4 *)((long)in_RDI + 0x3c) = *(undefined4 *)(*(long *)*in_RDI + 0x3c);
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(*(long *)*in_RDI + 0x40);
  *(undefined4 *)((long)in_RDI + 0x44) = *(undefined4 *)(*(long *)*in_RDI + 0x44);
  *(undefined4 *)(in_RDI + 9) = *(undefined4 *)(*(long *)*in_RDI + 0x48);
  *(undefined4 *)((long)in_RDI + 0x4c) = *(undefined4 *)(*(long *)*in_RDI + 0x4c);
  *(undefined4 *)(in_RDI + 10) = *(undefined4 *)(*(long *)*in_RDI + 0x50);
  *(undefined4 *)((long)in_RDI + 0x54) = *(undefined4 *)(*(long *)*in_RDI + 0x54);
  *(undefined1 *)(in_RDI + 0xb) = 0;
  std::
  multimap<float,_hrvo::Agent::Candidate,_std::less<float>,_std::allocator<std::pair<const_float,_hrvo::Agent::Candidate>_>_>
  ::multimap((multimap<float,_hrvo::Agent::Candidate,_std::less<float>,_std::allocator<std::pair<const_float,_hrvo::Agent::Candidate>_>_>
              *)0x1038a8);
  std::
  set<std::pair<float,_unsigned_long>,_std::less<std::pair<float,_unsigned_long>_>,_std::allocator<std::pair<float,_unsigned_long>_>_>
  ::set((set<std::pair<float,_unsigned_long>,_std::less<std::pair<float,_unsigned_long>_>,_std::allocator<std::pair<float,_unsigned_long>_>_>
         *)0x1038be);
  std::vector<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>::vector
            ((vector<hrvo::Agent::VelocityObstacle,_std::allocator<hrvo::Agent::VelocityObstacle>_>
              *)0x1038d1);
  return;
}

Assistant:

Agent::Agent(Simulator *simulator, const Vector2 &position, std::size_t goalNo)
    : simulator_(simulator),
      newVelocity_(simulator_->defaults_->velocity_),
      position_(position),
      velocity_(simulator_->defaults_->velocity_),
      goalNo_(goalNo),
      maxNeighbors_(simulator_->defaults_->maxNeighbors_),
      goalRadius_(simulator_->defaults_->goalRadius_),
      maxAccel_(simulator_->defaults_->maxAccel_),
      maxSpeed_(simulator_->defaults_->maxSpeed_),
      neighborDist_(simulator_->defaults_->neighborDist_),
      orientation_(simulator_->defaults_->orientation_),
      prefSpeed_(simulator_->defaults_->prefSpeed_),
      radius_(simulator_->defaults_->radius_),
      uncertaintyOffset_(simulator_->defaults_->uncertaintyOffset_),
#if HRVO_DIFFERENTIAL_DRIVE
      leftWheelSpeed_(0.0F),
      rightWheelSpeed_(0.0F),
      timeToOrientation_(simulator_->defaults_->timeToOrientation_),
      wheelTrack_(simulator_->defaults_->wheelTrack_),
#endif /* HRVO_DIFFERENTIAL_DRIVE */
      reachedGoal_(false) {
#if HRVO_DIFFERENTIAL_DRIVE
  computeWheelSpeeds();
#endif /* HRVO_DIFFERENTIAL_DRIVE */
}